

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall CVmObjByteArray::write_to_data_file(CVmObjByteArray *this,CVmDataSource *fp)

{
  int iVar1;
  unsigned_long l;
  long *in_RSI;
  unsigned_long in_RDI;
  CVmDataSource *unaff_retaddr;
  CVmObjByteArray *in_stack_00000008;
  char buf [16];
  undefined1 local_28 [16];
  long *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_18 = in_RSI;
  l = get_element_count((CVmObjByteArray *)0x31b387);
  ::oswp4(local_28,l);
  iVar1 = (**(code **)(*local_18 + 0x20))(local_18,local_28,4);
  if (iVar1 == 0) {
    get_element_count((CVmObjByteArray *)0x31b3cc);
    iVar1 = write_to_file(in_stack_00000008,unaff_retaddr,
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CVmObjByteArray::write_to_data_file(CVmDataSource *fp)
{
    char buf[16];

    /* write the number of bytes in our array */
    oswp4(buf, get_element_count());
    if (fp->write(buf, 4))
        return 1;

    /* write the bytes */
    return write_to_file(fp, 1, get_element_count());
}